

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

size_t __thiscall kws::Parser::FindEndOfClass(Parser *this,size_t position)

{
  ulong uVar1;
  string *psVar2;
  byte bVar3;
  size_t pos;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = 0;
  if (position != 0xffffffffffffffff) {
    uVar8 = position;
  }
  psVar2 = &this->m_BufferNoComment;
  pos = std::__cxx11::string::find((char *)psVar2,0x16d6f2,uVar8);
  do {
    if (pos == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    uVar1 = pos + 1;
    uVar5 = (this->m_BufferNoComment)._M_string_length;
    if (uVar1 < uVar5) {
      uVar7 = uVar1;
      do {
        bVar3 = (psVar2->_M_dataplus)._M_p[uVar7];
        if (bVar3 < 0x20) {
          if ((bVar3 != 10) && (bVar3 != 0xd)) goto LAB_00122830;
        }
        else if (bVar3 != 0x20) {
          if (bVar3 != 0x3b) goto LAB_00122830;
          break;
        }
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
    sVar4 = FindOpeningChar(this,'}','{',pos,true);
    uVar5 = std::__cxx11::string::find((char *)psVar2,0x176916,0);
    if (uVar5 < uVar8) {
      do {
        sVar6 = uVar5;
        if (sVar4 != 0xffffffffffffffff) {
          if (uVar5 <= sVar4) {
            uVar7 = uVar5;
            do {
              sVar6 = uVar7;
              if ((psVar2->_M_dataplus)._M_p[uVar7] == '{') break;
              uVar7 = uVar7 + 1;
              sVar6 = uVar5;
            } while (sVar4 + 1 != uVar7);
          }
          if (sVar4 == sVar6) {
            return pos;
          }
        }
        uVar5 = std::__cxx11::string::find((char *)psVar2,0x176916,sVar6 + 1);
      } while (uVar5 < uVar8);
    }
LAB_00122830:
    pos = std::__cxx11::string::find((char *)psVar2,0x16d6f2,uVar1);
  } while( true );
}

Assistant:

size_t Parser::FindEndOfClass(size_t position) const
{
  if(position == std::string::npos)
    {
    position = 0;
    }

  // Try to find the end of the class
  size_t endclass = m_BufferNoComment.find("}",position);
  while(endclass != std::string::npos)
    {
    bool isClass = true;
    // if the next char is not a semicolon this cannot be a class
    for(size_t i=endclass+1;i<m_BufferNoComment.size();i++)
      {
      if( (m_BufferNoComment[i] != ' ') && (m_BufferNoComment[i] != '\r')
        && (m_BufferNoComment[i] != '\n') && (m_BufferNoComment[i] != ';')
        )
        {
        isClass = false;
        break;
        }
      if(m_BufferNoComment[i] == ';')
        {
        break;
        }
      }

    if(isClass)
      {
      size_t openingChar = this->FindOpeningChar('}','{',endclass,true);
      // check if we have the class name somewhere
      size_t classPos = m_BufferNoComment.find("class",0);
      while(classPos != std::string::npos && classPos<position)
        {
        if(classPos != std::string::npos && openingChar!= std::string::npos)
          {
          for(size_t i=classPos;i<openingChar+1;i++)
            {
            if(m_BufferNoComment[i] == '{')
              {
              classPos = i;
              break;
              }
            }
          if(openingChar == classPos)
            {
            return endclass;
            }
          }
        classPos = m_BufferNoComment.find("class",classPos+1);
        }
      }
    endclass = m_BufferNoComment.find("}",endclass+1);
    }
  return std::string::npos;
}